

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mhitm.c
# Opt level: O1

int hitmm(monst *magr,monst *mdef,attack *mattk)

{
  uint uVar1;
  boolean bVar2;
  int iVar3;
  obj *poVar4;
  char *pcVar5;
  char *pcVar6;
  char buf [256];
  char magr_name [256];
  char mdef_name [256];
  char acStack_328 [256];
  char local_228 [256];
  char local_128 [256];
  
  if (vis == '\0') {
    noises(magr,mattk);
    goto LAB_001c72e6;
  }
  if (magr->wormno == '\0') {
    if (((viz_array[magr->my][magr->mx] & 2U) == 0) &&
       (((((u.uprops[0x1e].intrinsic != 0 ||
           (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
            (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
          ((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')))) ||
         ((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0 &&
          (((youmonst.data)->mflags3 & 0x100) == 0)))) ||
        (((viz_array[magr->my][magr->mx] & 1U) == 0 || ((magr->data->mflags3 & 0x200) == 0))))))
    goto LAB_001c6d4e;
LAB_001c6cf8:
    uVar1 = *(uint *)&magr->field_0x60;
    if (((uVar1 & 2) != 0) && ((u.uprops[0xc].intrinsic == 0 && (u.uprops[0xc].extrinsic == 0)))) {
      if (((uVar1 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0))
      goto LAB_001c6d41;
      goto LAB_001c6d4e;
    }
    if ((uVar1 & 0x280) != 0) goto LAB_001c6d4e;
LAB_001c6d41:
    if ((u._1052_1_ & 0x20) != 0) goto LAB_001c6d4e;
  }
  else {
    bVar2 = worm_known(level,magr);
    if (bVar2 != '\0') goto LAB_001c6cf8;
LAB_001c6d4e:
    if (((magr->data->mflags1 & 0x10000) == 0) &&
       ((poVar4 = which_armor(magr,4), poVar4 == (obj *)0x0 ||
        (poVar4 = which_armor(magr,4), poVar4->otyp != 0x4f)))) {
      if (((u.uprops[0x1e].intrinsic == 0) &&
          (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
           (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
         (((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')) ||
          ((((youmonst.data != mons + 0x31 && youmonst.data != mons + 0x1e) &&
            (u.uprops[0x19].extrinsic == 0 && u.uprops[0x19].intrinsic == 0)) &&
            youmonst.data != mons + 0x32 || (u.uprops[0x19].blocked != 0)))))) {
        if ((u.uprops[0x19].extrinsic == 0) || (u.uprops[0x19].blocked != 0)) goto LAB_001c6e91;
        iVar3 = dist2((int)magr->mx,(int)magr->my,(int)u.ux,(int)u.uy);
        if ((iVar3 < 0x41) || (u.uprops[0x42].intrinsic != 0)) goto LAB_001c6ecc;
        goto LAB_001c6ea1;
      }
    }
    else {
LAB_001c6e91:
      if (u.uprops[0x42].intrinsic == 0) {
LAB_001c6ea1:
        if ((u.uprops[0x42].extrinsic == 0) && (bVar2 = match_warn_of_mon(magr), bVar2 == '\0')) {
          map_invisible(magr->mx,magr->my);
        }
      }
    }
  }
LAB_001c6ecc:
  if (mdef->wormno == '\0') {
    if (((viz_array[mdef->my][mdef->mx] & 2U) == 0) &&
       (((((u.uprops[0x1e].intrinsic != 0 ||
           (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
            (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
          ((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')))) ||
         ((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0 &&
          (((youmonst.data)->mflags3 & 0x100) == 0)))) ||
        (((viz_array[mdef->my][mdef->mx] & 1U) == 0 || ((mdef->data->mflags3 & 0x200) == 0))))))
    goto LAB_001c6ff3;
LAB_001c6f9d:
    uVar1 = *(uint *)&mdef->field_0x60;
    if (((uVar1 & 2) != 0) && ((u.uprops[0xc].intrinsic == 0 && (u.uprops[0xc].extrinsic == 0)))) {
      if (((uVar1 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0))
      goto LAB_001c6fe6;
      goto LAB_001c6ff3;
    }
    if ((uVar1 & 0x280) != 0) goto LAB_001c6ff3;
LAB_001c6fe6:
    if ((u._1052_1_ & 0x20) != 0) goto LAB_001c6ff3;
  }
  else {
    bVar2 = worm_known(level,mdef);
    if (bVar2 != '\0') goto LAB_001c6f9d;
LAB_001c6ff3:
    if (((mdef->data->mflags1 & 0x10000) == 0) &&
       ((poVar4 = which_armor(mdef,4), poVar4 == (obj *)0x0 ||
        (poVar4 = which_armor(mdef,4), poVar4->otyp != 0x4f)))) {
      if (((u.uprops[0x1e].intrinsic == 0) &&
          (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
           (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
         (((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')) ||
          ((((youmonst.data != mons + 0x31 && youmonst.data != mons + 0x1e) &&
            (u.uprops[0x19].extrinsic == 0 && u.uprops[0x19].intrinsic == 0)) &&
            youmonst.data != mons + 0x32 || (u.uprops[0x19].blocked != 0)))))) {
        if ((u.uprops[0x19].extrinsic == 0) || (u.uprops[0x19].blocked != 0)) goto LAB_001c7136;
        iVar3 = dist2((int)mdef->mx,(int)mdef->my,(int)u.ux,(int)u.uy);
        if ((iVar3 < 0x41) || (u.uprops[0x42].intrinsic != 0)) goto LAB_001c7171;
        goto LAB_001c7146;
      }
    }
    else {
LAB_001c7136:
      if (u.uprops[0x42].intrinsic == 0) {
LAB_001c7146:
        if ((u.uprops[0x42].extrinsic == 0) && (bVar2 = match_warn_of_mon(mdef), bVar2 == '\0')) {
          map_invisible(mdef->mx,mdef->my);
        }
      }
    }
  }
LAB_001c7171:
  if (mdef->m_ap_type != '\0') {
    seemimic(mdef);
  }
  if (magr->m_ap_type != '\0') {
    seemimic(magr);
  }
  iVar3 = could_seduce(magr,mdef,mattk);
  if ((iVar3 != 0) && ((magr->field_0x61 & 1) == 0)) {
    pcVar5 = Monnam(magr);
    pcVar6 = "smiles at";
    if ((*(uint *)&mdef->field_0x60 >> 0x11 & 1) == 0) {
      pcVar6 = "talks to";
    }
    sprintf(acStack_328,"%s %s",pcVar5,pcVar6);
    pcVar5 = mon_nam(mdef);
    pcVar6 = "seductively";
    if (iVar3 == 2) {
      pcVar6 = "engagingly";
    }
    pline("%s %s %s.",acStack_328,pcVar5,pcVar6);
    goto LAB_001c72e6;
  }
  pcVar5 = Monnam(magr);
  strcpy(local_228,pcVar5);
  switch(mattk->aatyp) {
  case '\x02':
    pcVar6 = "%s bites";
    break;
  default:
switchD_001c7248_caseD_3:
    pcVar6 = "%s hits";
    break;
  case '\x04':
    pcVar6 = "%s butts";
    break;
  case '\x05':
    pcVar6 = "%s touches";
    break;
  case '\x06':
    pcVar6 = "%s stings";
    break;
  case '\a':
    if (u.ustuck == magr) goto switchD_001c7248_caseD_3;
    pcVar6 = "%s squeezes";
    break;
  case '\x10':
    pcVar5 = s_suffix(local_228);
    pcVar6 = "%s tentacles suck";
    goto LAB_001c72b5;
  }
  pcVar5 = local_228;
LAB_001c72b5:
  sprintf(acStack_328,pcVar6,pcVar5);
  mon_nam_too(local_128,mdef,magr);
  pline("%s %s.",acStack_328,local_128);
LAB_001c72e6:
  iVar3 = mdamagem(magr,mdef,mattk);
  return iVar3;
}

Assistant:

static int hitmm(struct monst *magr, struct monst *mdef, const struct attack *mattk)
{
	if (vis){
		int compat;
		char buf[BUFSZ], mdef_name[BUFSZ];

		if (!canspotmon(level, magr))
		    map_invisible(magr->mx, magr->my);
		if (!canspotmon(level, mdef))
		    map_invisible(mdef->mx, mdef->my);
		if (mdef->m_ap_type) seemimic(mdef);
		if (magr->m_ap_type) seemimic(magr);
		if ((compat = could_seduce(magr,mdef,mattk)) && !magr->mcan) {
			sprintf(buf, "%s %s", Monnam(magr),
				mdef->mcansee ? "smiles at" : "talks to");
			pline("%s %s %s.", buf, mon_nam(mdef),
				compat == 2 ?
					"engagingly" : "seductively");
		} else {
		    char magr_name[BUFSZ];

		    strcpy(magr_name, Monnam(magr));
		    switch (mattk->aatyp) {
			case AT_BITE:
				sprintf(buf,"%s bites", magr_name);
				break;
			case AT_STNG:
				sprintf(buf,"%s stings", magr_name);
				break;
			case AT_BUTT:
				sprintf(buf,"%s butts", magr_name);
				break;
			case AT_TUCH:
				sprintf(buf,"%s touches", magr_name);
				break;
			case AT_TENT:
				sprintf(buf, "%s tentacles suck",
					s_suffix(magr_name));
				break;
			case AT_HUGS:
				if (magr != u.ustuck) {
				    sprintf(buf,"%s squeezes", magr_name);
				    break;
				}
			default:
				sprintf(buf,"%s hits", magr_name);
		    }
		    pline("%s %s.", buf, mon_nam_too(mdef_name, mdef, magr));
		}
	} else  noises(magr, mattk);
	return mdamagem(magr, mdef, mattk);
}